

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::resp_appendix::serialize(resp_appendix *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint8_t *in_RSI;
  ptr<buffer> pVar1;
  buffer_serializer bs;
  
  buffer::alloc((buffer *)this,2);
  buffer_serializer::buffer_serializer(&bs,*(buffer **)this,LITTLE);
  buffer_serializer::put_u8(&bs,'\0');
  buffer_serializer::put_u8(&bs,*in_RSI);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> serialize() const {
        const static uint8_t CUR_VERSION = 0;
        size_t buf_len = sizeof(CUR_VERSION) + sizeof(extra_order_);

        //  << Format >>
        // Format version       1 byte
        // Extra order          1 byte

        ptr<buffer> result = buffer::alloc(buf_len);
        buffer_serializer bs(*result);
        bs.put_u8(CUR_VERSION);
        bs.put_u8(extra_order_);

        return result;
    }